

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRSearchPath.h
# Opt level: O3

string * __thiscall
MinVR::VRSearchPlugin::_selectFile
          (string *__return_storage_ptr__,VRSearchPlugin *this,string *file,string *directory)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  string dir_with_slash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string buildType;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  pcVar1 = (directory->_M_dataplus)._M_p;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + directory->_M_string_length);
  local_d0 = &local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_b0,local_a8 + (long)local_b0);
  std::__cxx11::string::append((char *)&local_d0);
  std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)local_90,local_b0,local_a8 + (long)local_b0);
  std::__cxx11::string::append((char *)local_90);
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)local_90,(ulong)(file->_M_dataplus)._M_p)
  ;
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50[0]);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_c0 = *plVar4;
    lStack_b8 = plVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar4;
    local_d0 = (long *)*plVar3;
  }
  local_c8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string _selectFile(const std::string &file,
                          const std::string &directory) const {

    std::string buildType = "";
#ifdef MinVR_DEBUG
    buildType = "d";
#endif

    std::string dir_with_slash = directory;
    if ((dir_with_slash[dir_with_slash.length() - 1] != '/') || (dir_with_slash[dir_with_slash.length() - 1] != '\\')) {
        dir_with_slash = dir_with_slash + "/";
    }


#if defined(WIN32)
    return dir_with_slash + file + buildType + ".dll";

#elif defined(__APPLE__)
    return dir_with_slash + "lib" + file + buildType + ".dylib";

#else // Linux
    return dir_with_slash + "lib" + file + buildType + ".so";

#endif
  }